

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O2

size_t __thiscall cali::Entry::pack(Entry *this,uchar *buffer)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = vlenc_u64(this->m_node->m_id,buffer);
  if (this->m_node->m_attribute == 8) {
    sVar2 = Variant::pack(&this->m_value,buffer + sVar1);
    sVar1 = sVar1 + sVar2;
  }
  return sVar1;
}

Assistant:

size_t Entry::pack(unsigned char* buffer) const
{
    size_t pos = 0;
    pos += vlenc_u64(m_node->id(), buffer);
    if (m_node->attribute() == Attribute::NAME_ATTR_ID)
        pos += m_value.pack(buffer + pos);
    return pos;
}